

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_means_template.h
# Opt level: O0

int calc_dist_dim2(int16_t *p1,int16_t *p2)

{
  int diff;
  int i;
  int dist;
  int16_t *p2_local;
  int16_t *p1_local;
  
  dist = 0;
  for (i = 0; i < 2; i = i + 1) {
    dist = ((int)p1[i] - (int)p2[i]) * ((int)p1[i] - (int)p2[i]) + dist;
  }
  return dist;
}

Assistant:

static int RENAME(calc_dist)(const int16_t *p1, const int16_t *p2) {
#if AV1_K_MEANS_DIM == 1
  return abs(p1[0] - p2[0]);
#else
  int dist = 0;
  for (int i = 0; i < AV1_K_MEANS_DIM; ++i) {
    const int diff = p1[i] - p2[i];
    dist += diff * diff;
  }
  return dist;
#endif
}